

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

int float64_lt_quiet_mips64el(float64 a,float64 b,float_status *status)

{
  bool bVar1;
  
  if ((status->flush_inputs_to_zero != '\0') &&
     ((a & 0xfffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0)) {
    a = a & 0x8000000000000000;
    status->float_exception_flags = status->float_exception_flags | 0x40;
  }
  if ((status->flush_inputs_to_zero != '\0') &&
     ((b & 0xfffffffffffff) != 0 && (b & 0x7ff0000000000000) == 0)) {
    b = b & 0x8000000000000000;
    status->float_exception_flags = status->float_exception_flags | 0x40;
  }
  if (((~a & 0x7ff0000000000000) != 0 || (a & 0xfffffffffffff) == 0) &&
     ((b & 0xfffffffffffff) == 0 || (~b & 0x7ff0000000000000) != 0)) {
    if ((long)(b ^ a) < 0) {
      bVar1 = ((b | a) & 0x7fffffffffffffff) != 0 && (long)a < 0;
    }
    else {
      bVar1 = (long)a < 0 != a < b && a != b;
    }
    goto LAB_0092c6fd;
  }
  if (status->snan_bit_is_one == '\0') {
    bVar1 = (a & 0x7ffffffffffff) != 0 && (a & 0x7ff8000000000000) == 0x7ff0000000000000;
  }
  else {
    bVar1 = 0xffe < ((uint)(a >> 0x33) & 0xfff);
  }
  if (bVar1) {
LAB_0092c6f7:
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  else {
    if (status->snan_bit_is_one == '\0') {
      bVar1 = (b & 0x7ffffffffffff) != 0 && (b & 0x7ff8000000000000) == 0x7ff0000000000000;
    }
    else {
      bVar1 = 0xffe < ((uint)(b >> 0x33) & 0xfff);
    }
    if (bVar1) goto LAB_0092c6f7;
  }
  bVar1 = false;
LAB_0092c6fd:
  return (int)bVar1;
}

Assistant:

int float64_lt_quiet(float64 a, float64 b, float_status *status)
{
    flag aSign, bSign;
    uint64_t av, bv;
    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);

    if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
         || ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
       ) {
        if (float64_is_signaling_nan(a, status)
         || float64_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    aSign = extractFloat64Sign( a );
    bSign = extractFloat64Sign( b );
    av = float64_val(a);
    bv = float64_val(b);
    if ( aSign != bSign ) return aSign && ( (uint64_t) ( ( av | bv )<<1 ) != 0 );
    return ( av != bv ) && ( aSign ^ ( av < bv ) );

}